

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::EnterScriptEnd(ThreadContext *this,ScriptEntryExitRecord *record,bool doCleanup)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  uint uVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  RecyclableData *pRVar7;
  FunctionEntryPointInfo **ppFVar8;
  ThreadServiceWrapper *pTVar9;
  ThreadServiceWrapper *threadServiceWrapper;
  FunctionEntryPointInfo *local_40;
  FunctionEntryPointInfo *next;
  FunctionEntryPointInfo *local_30;
  FunctionEntryPointInfo *current;
  InterruptPoller *poller;
  ScriptEntryExitRecord *pSStack_18;
  bool doCleanup_local;
  ScriptEntryExitRecord *record_local;
  ThreadContext *this_local;
  
  poller._7_1_ = doCleanup;
  pSStack_18 = record;
  record_local = (ScriptEntryExitRecord *)this;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,RunPhase);
  if (bVar2) {
    DVar3 = ::GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> EnterScriptEnd  (%p): Level %d\n",(ulong)DVar3,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  PopEntryExitRecord(this,pSStack_18);
  bVar2 = IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x5bc,"(this->IsScriptActive())",
                       "Missing EnterScriptStart or LeaveScriptEnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this->isScriptActive = false;
  pRVar6 = GetRecycler(this);
  Memory::Recycler::SetIsScriptActive(pRVar6,false);
  this->callRootLevel = this->callRootLevel - 1;
  ExceptionCheck::SetHandledExceptionType(pSStack_18->handledExceptionType);
  Memory::Recycler::Verify(this->recycler,RunPhase);
  if (this->callRootLevel == 0) {
    pRVar6 = GetRecycler(this);
    Memory::Recycler::SetIsInScript(pRVar6,false);
    current = (FunctionEntryPointInfo *)this->interruptPoller;
    if (current != (FunctionEntryPointInfo *)0x0) {
      InterruptPoller::EndScript((InterruptPoller *)current);
    }
    ClosePendingScriptContexts(this);
    if (this->rootPendingClose != (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x5d1,"(rootPendingClose == nullptr)","rootPendingClose == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((this->hasThrownPendingException & 1U) != 0) {
      ClearPendingOOMError(this);
      ClearPendingSOError(this);
      this->hasThrownPendingException = false;
    }
    Js::DelayedFreeArrayBuffer::ClearAll(&this->delayFreeCallback);
    if ((DAT_01ea4198 & 1) != 0) {
      pRVar7 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionEntryPointInfo__
                          ((WriteBarrierPtr *)&pRVar7->oldEntryPointInfo);
      local_30 = *ppFVar8;
      next = (FunctionEntryPointInfo *)0x0;
      pRVar7 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
                (&pRVar7->oldEntryPointInfo,&next);
      while (local_30 != (FunctionEntryPointInfo *)0x0) {
        ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionEntryPointInfo__
                            ((WriteBarrierPtr *)&local_30->nextEntryPoint);
        local_40 = *ppFVar8;
        threadServiceWrapper = (ThreadServiceWrapper *)0x0;
        Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
                  (&local_30->nextEntryPoint,&threadServiceWrapper);
        local_30 = local_40;
      }
    }
    if ((poller._7_1_ & 1) != 0) {
      pTVar9 = GetThreadServiceWrapper(this);
      if ((pTVar9 == (ThreadServiceWrapper *)0x0) ||
         (uVar4 = (**pTVar9->_vptr_ThreadServiceWrapper)(), (uVar4 & 1) == 0)) {
        Memory::Recycler::CollectNow<(Memory::CollectionFlags)2449477633>(this->recycler);
      }
      Memory::Recycler::LeaveIdleDecommit(this->recycler);
    }
  }
  if ((poller._7_1_ & 1) != 0) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,DisposePhase);
    if (bVar2) {
      bVar2 = Memory::Recycler::NeedDispose(this->recycler);
      Output::Print(L"[Dispose] NeedDispose in EnterScriptEnd: %d\n",(ulong)bVar2);
      Output::Flush();
    }
    Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32768>(this->recycler);
  }
  return;
}

Assistant:

void
ThreadContext::EnterScriptEnd(Js::ScriptEntryExitRecord * record, bool doCleanup)
{
#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> EnterScriptEnd  (%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif
    this->PopEntryExitRecord(record);
    AssertMsg(this->IsScriptActive(),
              "Missing EnterScriptStart or LeaveScriptEnd");
    this->isScriptActive = false;
    this->GetRecycler()->SetIsScriptActive(false);
    this->callRootLevel--;
#ifdef EXCEPTION_CHECK
    ExceptionCheck::SetHandledExceptionType(record->handledExceptionType);
#endif
#ifdef RECYCLER_MEMORY_VERIFY
    recycler->Verify(Js::RunPhase);
#endif

    if (this->callRootLevel == 0)
    {
        RECORD_TIMESTAMP(lastScriptEndTime);
        this->GetRecycler()->SetIsInScript(false);
        InterruptPoller *poller = this->interruptPoller;
        if (poller)
        {
            poller->EndScript();
        }
        ClosePendingScriptContexts();
        Assert(rootPendingClose == nullptr);

        if (this->hasThrownPendingException)
        {
            // We have some cases where the thread instant of JavascriptExceptionObject
            // are ignored and not clear. To avoid leaks, clear it here when
            // we are not in script, where no one should be using these JavascriptExceptionObject
            this->ClearPendingOOMError();
            this->ClearPendingSOError();
            this->hasThrownPendingException = false;
        }

        delayFreeCallback.ClearAll();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.FreeRejittedCode)
#endif
        {
            // Since we're no longer in script, old entry points can now be collected
            Js::FunctionEntryPointInfo* current = this->recyclableData->oldEntryPointInfo;
            this->recyclableData->oldEntryPointInfo = nullptr;

            // Clear out the next pointers so older entry points wont be held on
            // as a false positive

            while (current != nullptr)
            {
                Js::FunctionEntryPointInfo* next = current->nextEntryPoint;
                current->nextEntryPoint = nullptr;
                current = next;
            }
        }

        if (doCleanup)
        {
            ThreadServiceWrapper* threadServiceWrapper = GetThreadServiceWrapper();
            if (!threadServiceWrapper || !threadServiceWrapper->ScheduleNextCollectOnExit())
            {
                // Do the idle GC now if we fail schedule one.
                recycler->CollectNow<CollectOnScriptExit>();
            }
            recycler->LeaveIdleDecommit();
        }
    }

    if (doCleanup)
    {
        PHASE_PRINT_TRACE1(Js::DisposePhase, _u("[Dispose] NeedDispose in EnterScriptEnd: %d\n"), this->recycler->NeedDispose());
        this->recycler->FinishDisposeObjectsNow<FinishDispose>();
    }

    JS_ETW_INTERNAL(EventWriteJSCRIPT_RUN_STOP(this,0));
}